

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddSubDirectoryCommand::Clone(cmAddSubDirectoryCommand *this)

{
  cmCommand *this_00;
  cmAddSubDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddSubDirectoryCommand((cmAddSubDirectoryCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmAddSubDirectoryCommand; }